

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenWorkItem.cpp
# Opt level: O0

void __thiscall
CodeGenWorkItem::CodeGenWorkItem
          (CodeGenWorkItem *this,JobManager *manager,FunctionBody *functionBody,
          EntryPointInfo *entryPointInfo,bool isJitInDebugMode,CodeGenWorkItemType type)

{
  undefined1 local_90 [102];
  CodeGenWorkItemType local_2a;
  byte local_29;
  CodeGenWorkItemType type_local;
  EntryPointInfo *pEStack_28;
  bool isJitInDebugMode_local;
  EntryPointInfo *entryPointInfo_local;
  FunctionBody *functionBody_local;
  JobManager *manager_local;
  CodeGenWorkItem *this_local;
  
  local_2a = type;
  local_29 = isJitInDebugMode;
  pEStack_28 = entryPointInfo;
  entryPointInfo_local = (EntryPointInfo *)functionBody;
  functionBody_local = (FunctionBody *)manager;
  manager_local = (JobManager *)this;
  JsUtil::Job::Job(&this->super_Job,manager,false);
  this->_vptr_CodeGenWorkItem = (_func_int **)&PTR___cxa_pure_virtual_01dd7130;
  this->functionBody = (FunctionBody *)entryPointInfo_local;
  this->entryPointInfo = pEStack_28;
  this->recyclableData = (CodeGenRecyclableData *)0x0;
  this->isInJitQueue = false;
  this->isAllocationCommitted = false;
  this->queuedFullJitWorkItem = (QueuedFullJitWorkItem *)0x0;
  this->allocation =
       (EmitBufferAllocation<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *)
       0x0;
  memset(local_90,0,0x60);
  memcpy(&this->jitData,local_90,0x60);
  (this->jitData).type = local_2a;
  (this->jitData).isJitInDebugMode = local_29 & 1;
  ResetJitMode(this);
  return;
}

Assistant:

CodeGenWorkItem::CodeGenWorkItem(
    JsUtil::JobManager *const manager,
    Js::FunctionBody *const functionBody,
    Js::EntryPointInfo* entryPointInfo,
    bool isJitInDebugMode,
    CodeGenWorkItemType type)
    : JsUtil::Job(manager)
    , functionBody(functionBody)
    , entryPointInfo(entryPointInfo)
    , recyclableData(nullptr)
    , isInJitQueue(false)
    , isAllocationCommitted(false)
    , queuedFullJitWorkItem(nullptr)
    , allocation(nullptr)
#ifdef IR_VIEWER
    , isRejitIRViewerFunction(false)
    , irViewerOutput(nullptr)
    , irViewerRequestContext(nullptr)
#endif
{
    this->jitData = {0};
    // work item data
    this->jitData.type = type;
    this->jitData.isJitInDebugMode = isJitInDebugMode;
    ResetJitMode();
}